

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkService.cpp
# Opt level: O0

void __thiscall NetworkService::poll_frontend(NetworkService *this)

{
  string_view trace;
  string_view trace_00;
  string_view trace_01;
  string_view trace_02;
  string_view trace_03;
  string_view trace_04;
  string_view trace_05;
  string_view trace_06;
  socket_t *socket;
  socket_t *socket_00;
  reference pvVar1;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  char *__str;
  DatabaseSnapshot *this_01;
  size_t in_RDI;
  WorkerContext *wctx;
  string worker_addr;
  Task task;
  runtime_error *err_1;
  TaskSpec *spec;
  runtime_error *err;
  Command cmd;
  DatabaseSnapshot snapshot;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  locks;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> request;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> client_addr;
  DatabaseSnapshot *in_stack_fffffffffffffab8;
  DatabaseSnapshot *in_stack_fffffffffffffac0;
  Task *in_stack_fffffffffffffac8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffad0;
  key_type *in_stack_fffffffffffffad8;
  DatabaseSnapshot *in_stack_fffffffffffffae0;
  Command *in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffb24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb28;
  socket_t *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  socket_t *in_stack_fffffffffffffb58;
  char *in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffb68;
  string local_450 [24];
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  *in_stack_fffffffffffffbc8;
  string *in_stack_fffffffffffffbd0;
  string *in_stack_fffffffffffffbd8;
  Database *in_stack_fffffffffffffbe0;
  Database *in_stack_fffffffffffffcb8;
  string local_78 [80];
  string local_28 [40];
  
  socket = (socket_t *)(in_RDI + 0x10);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
  trace_05._M_str = (char *)in_stack_fffffffffffffb68;
  trace_05._M_len = (size_t)in_stack_fffffffffffffb60;
  s_recv<std::__cxx11::string>(in_stack_fffffffffffffb58,trace_05);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
  trace_04._M_str = in_stack_fffffffffffffb60;
  trace_04._M_len = (size_t)in_stack_fffffffffffffb58;
  s_recv_padding(socket,trace_04);
  socket_00 = (socket_t *)(in_RDI + 0x10);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
  trace_06._M_str = (char *)in_stack_fffffffffffffb68;
  trace_06._M_len = (size_t)in_stack_fffffffffffffb60;
  s_recv<std::__cxx11::string>(in_stack_fffffffffffffb58,trace_06);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::vector((vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
            *)0x1291a3);
  Database::snapshot(in_stack_fffffffffffffcb8);
  parse_command(in_stack_fffffffffffffb68);
  dispatch_locks(in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::operator=((vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
               *)in_stack_fffffffffffffad0,
              (vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
               *)in_stack_fffffffffffffac8);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::~vector((vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
             *)in_stack_fffffffffffffad0);
  std::
  variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
  ::~variant((variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
              *)0x129222);
  Database::allocate_task
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbc8);
  Task::Task((Task *)in_stack_fffffffffffffac0,(TaskSpec *)in_stack_fffffffffffffab8);
  pvVar1 = std::
           queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::front((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x12980d);
  std::__cxx11::string::string(local_450,(string *)pvVar1);
  std::
  queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::pop((queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x129839);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<WorkerContext,_std::default_delete<WorkerContext>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<WorkerContext,_std::default_delete<WorkerContext>_>_>_>_>
  ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<WorkerContext,_std::default_delete<WorkerContext>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<WorkerContext,_std::default_delete<WorkerContext>_>_>_>_>
        *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  std::unique_ptr<WorkerContext,_std::default_delete<WorkerContext>_>::get
            ((unique_ptr<WorkerContext,_std::default_delete<WorkerContext>_> *)
             in_stack_fffffffffffffac0);
  std::optional<Task>::operator=
            ((optional<Task> *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  DatabaseSnapshot::operator=(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
  trace._M_len._4_4_ = in_stack_fffffffffffffb3c;
  trace._M_len._0_4_ = in_stack_fffffffffffffb38;
  trace._M_str = (char *)socket_00;
  s_send<std::__cxx11::string>
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,trace,in_stack_fffffffffffffb24);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffac8);
  trace_02._M_str = (char *)socket;
  trace_02._M_len = in_RDI;
  s_send_padding(socket_00,trace_02,in_stack_fffffffffffffb3c);
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this_00,(char *)in_stack_fffffffffffffac8);
  trace_00._M_len._4_4_ = in_stack_fffffffffffffb3c;
  trace_00._M_len._0_4_ = in_stack_fffffffffffffb38;
  trace_00._M_str = (char *)socket_00;
  s_send<std::__cxx11::string>
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,trace_00,in_stack_fffffffffffffb24)
  ;
  __str = (char *)(in_RDI + 0x20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,__str);
  trace_03._M_str = (char *)socket;
  trace_03._M_len = in_RDI;
  s_send_padding(socket_00,trace_03,in_stack_fffffffffffffb3c);
  this_01 = (DatabaseSnapshot *)(in_RDI + 0x20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,__str);
  trace_01._M_len._4_4_ = in_stack_fffffffffffffb3c;
  trace_01._M_len._0_4_ = in_stack_fffffffffffffb38;
  trace_01._M_str = (char *)socket_00;
  s_send<std::__cxx11::string>
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,trace_01,in_stack_fffffffffffffb24)
  ;
  std::__cxx11::string::~string(local_450);
  Task::~Task((Task *)0x129a32);
  DatabaseSnapshot::~DatabaseSnapshot(this_01);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::~vector((vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
             *)this_00);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void NetworkService::poll_frontend() {
    //  Now get next client request, route to LRU worker
    //  Client request is [address][empty][request]
    auto client_addr{s_recv<std::string>(&frontend, ZMQTRACE)};

    s_recv_padding(&frontend, ZMQTRACE);

    auto request{s_recv<std::string>(&frontend, ZMQTRACE)};

    std::vector<DatabaseLock> locks;
    DatabaseSnapshot snapshot = db.snapshot();

    try {
        Command cmd{parse_command(request)};
        locks = std::move(dispatch_locks(cmd, &snapshot));
    } catch (const std::runtime_error &err) {
        s_send(&frontend, client_addr, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&frontend, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&frontend, Response::error("Parse error").to_string(), ZMQTRACE);
        return;
    }

    TaskSpec *spec = nullptr;
    try {
        spec = db.allocate_task(request, client_addr, locks);
    } catch (const std::runtime_error &err) {
        s_send(&frontend, client_addr, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&frontend, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&frontend,
               Response::error("Can't acquire lock, try again later", true)
                   .to_string(),
               ZMQTRACE);
        return;
    }

    Task task{Task(spec)};

    std::string worker_addr = worker_queue.front();
    worker_queue.pop();
    WorkerContext *wctx = wctxs.at(worker_addr).get();
    wctx->task = std::move(task);
    wctx->snap = std::move(snapshot);

    s_send(&backend, worker_addr, ZMQTRACE, ZMQ_SNDMORE);
    s_send_padding(&backend, ZMQTRACE, ZMQ_SNDMORE);
    s_send(&backend, client_addr, ZMQTRACE, ZMQ_SNDMORE);
    s_send_padding(&backend, ZMQTRACE, ZMQ_SNDMORE);
    s_send(&backend, request, ZMQTRACE);
}